

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O2

int abuf_vappendf(autobuf *autobuf,char *format,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  ulong new_size;
  va_list ap2;
  
  if (autobuf == (autobuf *)0x0) {
    return 0;
  }
  ap2[0].reg_save_area = ap->reg_save_area;
  ap2[0].gp_offset = ap->gp_offset;
  ap2[0].fp_offset = ap->fp_offset;
  ap2[0].overflow_arg_area = ap->overflow_arg_area;
  uVar1 = vsnprintf(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,ap);
  if ((int)uVar1 < 0) {
LAB_00141f86:
    autobuf->_error = true;
  }
  else {
    new_size = (ulong)uVar1 + autobuf->_len;
    if (autobuf->_total <= new_size) {
      iVar2 = _autobuf_enlarge(autobuf,new_size);
      if (iVar2 < 0) {
        autobuf->_buf[autobuf->_len] = '\0';
        return -1;
      }
      uVar1 = vsnprintf(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,ap2);
      if ((int)uVar1 < 0) goto LAB_00141f86;
    }
    autobuf->_len = new_size;
  }
  return uVar1;
}

Assistant:

static int
_vappendf(struct autobuf *autobuf, const char *format, va_list ap, va_list ap2) {
  int rc;
  size_t min_size;

  if (autobuf == NULL)
    return 0;

  rc = vsnprintf(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, ap);
  if (rc < 0) {
    autobuf->_error = true;
    return rc;
  }
  min_size = autobuf->_len + (size_t)rc;
  if (min_size >= autobuf->_total) {
    if (_autobuf_enlarge(autobuf, min_size) < 0) {
      autobuf->_buf[autobuf->_len] = '\0';
      return -1;
    }
    rc = vsnprintf(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, ap2);
    if (rc < 0) {
      autobuf->_error = true;
      return rc;
    }
  }
  autobuf->_len = min_size;
  return rc;
}